

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O3

int wrterr(FILE *out,char *mess,int severity)

{
  int extraout_EAX;
  size_t sVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 uVar3;
  undefined4 *extraout_RDX;
  undefined4 *extraout_RDX_00;
  char *__s;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  FILE *out_00;
  FILE *__stream;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  char acStack_7b8 [1608];
  FILE *pFStack_170;
  undefined1 *puStack_168;
  char acStack_140 [264];
  FILE *pFStack_38;
  
  if (severity < err_report) {
    ffcmsg();
    iVar5 = 0;
  }
  else {
    iVar5 = nerrs + 1;
    builtin_strncpy(temp,"*** Error:   ",0xe);
    nerrs = iVar5;
    strcat(temp,mess);
    if (out != (FILE *)0x0) {
      in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),_stderr == (FILE *)out || _stdout == (FILE *)out)
      ;
      if (_stderr != (FILE *)out && _stdout != (FILE *)out) {
        print_fmt(out,temp,0xd);
      }
      mess = temp;
      print_fmt((FILE *)_stderr,temp,0xd);
      iVar5 = nerrs;
    }
    if (200 < iVar5) {
      out_00 = (FILE *)out;
      wrterr_cold_1();
      pcVar8 = acStack_140;
      pFStack_38 = out;
      if ((int)in_RCX < err_report) {
        ffcmsg();
        iVar5 = 0;
      }
      else {
        nerrs = nerrs + 1;
        builtin_strncpy(temp,"*** Error:   ",0xe);
        strcat(temp,mess);
        ffgerr(*extraout_RDX,acStack_140);
        strcat(temp,acStack_140);
        if (out_00 != (FILE *)0x0) {
          in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),_stderr == out_00 || _stdout == out_00);
          if (_stderr != out_00 && _stdout != out_00) {
            print_fmt((FILE *)out_00,temp,0xd);
          }
          pcVar8 = temp;
          print_fmt((FILE *)_stderr,temp,0xd);
        }
        *extraout_RDX = 0;
        ffcmsg();
        iVar5 = nerrs;
        if (200 < nerrs) {
          __stream = out_00;
          wrtferr_cold_1();
          pcVar11 = acStack_7b8;
          pcVar12 = acStack_7b8;
          pcVar13 = acStack_7b8;
          pFStack_170 = out_00;
          if ((int)in_RCX < err_report) {
            puStack_168 = acStack_140;
            ffcmsg();
            iVar5 = 0;
          }
          else {
            nerrs = nerrs + 1;
            builtin_strncpy(temp,"*** Error:   ",0xe);
            puStack_168 = acStack_140;
            strcat(temp,pcVar8);
            sVar1 = strlen(temp);
            builtin_strncpy(temp + sVar1,"(from CF",8);
            builtin_strncpy(temp + sVar1 + 8,"ITSIO er",8);
            builtin_strncpy(temp + sVar1 + 0xc,"O er",4);
            builtin_strncpy(temp + sVar1 + 0x10,"ror ",4);
            builtin_strncpy(temp + sVar1 + 0x14,"stac",4);
            builtin_strncpy(temp + sVar1 + 0x18,"k:)",4);
            lVar6 = 1;
            do {
              *pcVar11 = '\0';
              iVar5 = ffgmsg(pcVar11);
              uVar7 = (uint)pcVar8;
              uVar2 = (uint)in_RCX;
              if ((iVar5 == 0) && (*pcVar11 == '\0')) goto LAB_0011178b;
              lVar6 = lVar6 + 1;
              pcVar11 = pcVar11 + 0x50;
            } while (lVar6 != 0x15);
            lVar6 = 0x15;
LAB_0011178b:
            if (__stream != (FILE *)0x0) {
              uVar3 = CONCAT71((int7)((ulong)in_RCX >> 8),_stderr == __stream || _stdout == __stream
                              );
              if (_stderr != __stream && _stdout != __stream) {
                print_fmt((FILE *)__stream,temp,0xd);
                lVar10 = lVar6;
                do {
                  fprintf(__stream,"             %.67s\n",pcVar12);
                  pcVar12 = pcVar12 + 0x50;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
              print_fmt((FILE *)_stderr,temp,0xd);
              do {
                uVar7 = 0x1160be;
                fprintf(_stderr,"             %.67s\n",pcVar13);
                uVar2 = (uint)uVar3;
                pcVar13 = pcVar13 + 0x50;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
            }
            *extraout_RDX_00 = 0;
            ffcmsg();
            iVar5 = nerrs;
            if (200 < nerrs) {
              wrtserr_cold_1();
              sVar1 = strlen(__s);
              uVar9 = (uint)sVar1;
              if ((int)uVar2 < (int)uVar9) {
                uVar2 = uVar9;
              }
              if ((int)uVar2 < 1) {
                return uVar9;
              }
              pcVar8 = (char *)malloc((ulong)(uVar2 + 1));
              if ((int)uVar9 < 1) {
                memset(pcVar8,uVar7 & 0xff,(ulong)uVar2);
                pcVar11 = pcVar8 + uVar2;
              }
              else {
                uVar4 = (int)(uVar2 - uVar9) / 2;
                pcVar12 = pcVar8;
                if (1 < (int)(uVar2 - uVar9)) {
                  memset(pcVar8,uVar7 & 0xff,(ulong)(uVar4 - 1) + 1);
                  pcVar12 = pcVar8 + (ulong)(uVar4 - 1) + 1;
                }
                *pcVar12 = '\0';
                strcat(pcVar8,__s);
                pcVar11 = pcVar12 + (uVar9 & 0x7fffffff);
                if ((int)(uVar4 + uVar9) < (int)uVar2) {
                  uVar14 = (ulong)((uVar2 + ~uVar4) - uVar9);
                  memset(pcVar11,uVar7 & 0xff,uVar14 + 1);
                  pcVar11 = pcVar12 + (uVar9 & 0x7fffffff) + uVar14 + 1;
                }
              }
              *pcVar11 = '\0';
              if (__stream != (FILE *)0x0) {
                fprintf(__stream,"%s\n",pcVar8);
              }
              if (_stdout == __stream) {
                fflush(__stream);
              }
              free(pcVar8);
              return extraout_EAX;
            }
          }
          return iVar5;
        }
      }
      return iVar5;
    }
    ffcmsg();
    iVar5 = nerrs;
  }
  return iVar5;
}

Assistant:

int wrterr(FILE *out, char *mess, int severity )
{

    if(severity < err_report) { 
        fits_clear_errmsg();
        return 0; 
    }
    nerrs++;

    strcpy(temp,"*** Error:   ");
    strcat(temp,mess);
    if(out != NULL) {
         if ((out!=stdout) && (out!=stderr)) print_fmt(out,temp,13);
/*
   if ERR2OUT is defined, then error messages will be sent to the
   stdout stream rather than to stderr
*/
#ifdef ERR2OUT
         print_fmt(stdout,temp,13);
#else
         print_fmt(stderr,temp,13);
#endif
    }

    if(nerrs > MAXERRORS ) { 

#ifdef ERR2OUT
	 fprintf(stdout,"??? Too many Errors! I give up...\n");
#else
	 fprintf(stderr,"??? Too many Errors! I give up...\n");
#endif
         close_report(out);
         exit(1);
    }
    fits_clear_errmsg();
    return nerrs;
}